

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O1

void __thiscall
jrtplib::RTPFakeTransmissionInfo::~RTPFakeTransmissionInfo(RTPFakeTransmissionInfo *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPFakeTransmissionInfo_00144b58;
  p_Var2 = (this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->localIPlist) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

~RTPFakeTransmissionInfo()								{ }